

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

void __thiscall despot::BaseTag::Step(BaseTag *this)

{
  double *in_RCX;
  ACT_TYPE in_EDX;
  State *in_RSI;
  double in_XMM0_Qa;
  
  Step((BaseTag *)
       &this[-1].memory_pool_.freelist_.
        super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
        super__Vector_impl_data._M_finish,in_RSI,in_XMM0_Qa,in_EDX,in_RCX);
  return;
}

Assistant:

bool BaseTag::Step(State& s, double random_num, ACT_TYPE action,
	double& reward) const {
	TagState& state = static_cast<TagState&>(s);

	bool terminal = false;
	if (action == TagAction()) {
		if (rob_[state.state_id] == opp_[state.state_id]) {
			reward = TAG_REWARD;
			terminal = true;
		} else {
			reward = -TAG_REWARD;
		}
	} else {
		reward = -1;
	}

	const vector<State>& distribution =
		transition_probabilities_[state.state_id][action];
	double sum = 0;
	for (int i = 0; i < distribution.size(); i++) {
		const State& next = distribution[i];
		sum += next.weight;
		if (sum >= random_num) {
			state.state_id = next.state_id;
			break;
		}
	}

	return terminal;
}